

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O1

void __thiscall
lzham::search_accelerator::find_all_matches_callback
          (search_accelerator *this,uint64 data,void *pData_ptr)

{
  atomic32_t *paVar1;
  long *plVar2;
  uchar *puVar3;
  uchar *puVar4;
  byte bVar5;
  bool bVar6;
  byte bVar7;
  uchar *puVar8;
  uint *puVar9;
  CLZBase *pCVar10;
  node *pnVar11;
  uint uVar12;
  uint uVar13;
  long *plVar14;
  uchar *puVar15;
  uint uVar16;
  uint uVar17;
  node *pnVar18;
  node *pnVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  long *plVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  node *pnVar28;
  uint uVar29;
  ulong uVar30;
  long *plVar31;
  uint uVar32;
  ulong uVar33;
  node *pnVar34;
  uchar *puVar35;
  uint uVar36;
  bool bVar37;
  dict_match temp_matches [256];
  uint local_5bc;
  uint *local_5b8;
  uint local_594;
  uint local_560;
  uint local_538 [322];
  
  uVar36 = this->m_fill_lookahead_pos;
  uVar23 = this->m_fill_lookahead_size;
  uVar16 = 0;
  uVar12 = 0;
  if (1 < uVar23) {
    uVar16 = this->m_max_dict_size_mask & uVar36;
    puVar8 = (this->m_dict).m_p;
    uVar12 = (uint)puVar8[uVar16];
    uVar16 = (uint)puVar8[uVar16 + 1];
  }
  if (2 < uVar23) {
    local_594 = this->m_fill_dict_size;
    puVar8 = (this->m_dict).m_p;
    do {
      uVar20 = uVar16;
      uVar26 = this->m_max_dict_size_mask & uVar36;
      bVar5 = puVar8[uVar26 + 2];
      uVar16 = (uint)bVar5 << 4 ^ (uVar20 << 8 | uVar12);
      if (((this->m_hash_thread_index).m_size == 0) ||
         (local_560 = (uint)data, (this->m_hash_thread_index).m_p[uVar16] == local_560)) {
        puVar9 = (this->m_hash).m_p;
        uVar12 = puVar9[uVar16];
        puVar9[uVar16] = uVar36;
        pCVar10 = this->m_pLZBase;
        pnVar11 = (this->m_nodes).m_p;
        pnVar34 = pnVar11 + uVar26;
        pnVar19 = (node *)&pnVar11[uVar26].m_right;
        uVar30 = 0x101;
        if (uVar23 < 0x101) {
          uVar30 = (ulong)uVar23;
        }
        plVar14 = (long *)(puVar8 + uVar26);
        uVar21 = this->m_max_probes;
        bVar6 = this->m_all_matches;
        local_5bc = 2;
        local_5b8 = local_538;
        do {
          bVar37 = uVar21 == 0;
          uVar21 = uVar21 - 1;
          if (((bVar37) || (uVar36 == uVar12)) || (uVar16 = uVar36 - uVar12, local_594 <= uVar16)) {
            bVar37 = false;
            pnVar34->m_left = 0;
            pnVar19->m_left = 0;
          }
          else {
            uVar27 = (ulong)(this->m_max_dict_size_mask & uVar12);
            plVar2 = (long *)(puVar8 + uVar27);
            plVar31 = plVar14;
            for (plVar24 = plVar2;
                (plVar24 < (long *)((long)plVar2 + (uVar30 - 7)) && (*plVar24 == *plVar31));
                plVar24 = plVar24 + 1) {
              plVar31 = plVar31 + 1;
            }
            uVar29 = (uint)uVar30;
            uVar32 = (uint)((long)plVar24 - (long)plVar2);
            bVar37 = uVar29 <= uVar32;
            if ((uVar32 < uVar29) &&
               (uVar33 = (long)plVar24 - (long)plVar2 & 0xffffffff,
               *(char *)((long)plVar2 + uVar33) == *(char *)((long)plVar14 + uVar33))) {
              puVar35 = puVar8 + uVar27 + 1;
              lVar25 = 1;
              iVar22 = 0;
              puVar15 = puVar8 + (ulong)uVar26 + 1;
              do {
                bVar37 = uVar30 <= uVar33 + lVar25;
                if (bVar37) {
                  iVar22 = (int)lVar25;
                  break;
                }
                puVar4 = puVar35 + uVar33;
                lVar25 = lVar25 + 1;
                iVar22 = iVar22 + 1;
                puVar35 = puVar35 + 1;
                puVar3 = puVar15 + uVar33;
                puVar15 = puVar15 + 1;
              } while (*puVar4 == *puVar3);
              uVar32 = uVar32 + iVar22;
            }
            pnVar18 = pnVar11 + uVar27;
            if (local_5bc < uVar32) {
              *(char *)(local_5b8 + 1) = (char)uVar32 + -2;
              *local_5b8 = uVar16;
              local_5b8 = (uint *)((long)local_5b8 + 5);
              local_5bc = uVar32;
              if (uVar32 == uVar29) {
                pnVar34->m_left = pnVar18->m_left;
                pnVar19->m_left = pnVar18->m_right;
                bVar37 = false;
                goto LAB_0010d7c5;
              }
            }
            else if ((bVar6 & 1U) == 0) {
              if (local_5bc < 3) {
                local_5bc = 2;
              }
              else if (local_5bc == uVar32) {
                uVar29 = *(uint *)((long)local_5b8 + -5);
                if ((ulong)uVar29 < 0x1000) {
                  uVar17 = (uint)pCVar10->m_slot_tab0[uVar29];
                }
                else {
                  if (uVar29 < 0x100000) {
                    bVar7 = pCVar10->m_slot_tab1[uVar29 >> 0xb];
                  }
                  else {
                    if (0xffffff < uVar29) {
                      if (uVar29 < 0x2000000) {
                        uVar17 = (uVar29 - 0x1000000 >> 0x17) + 0x30;
                      }
                      else if (uVar29 < 0x4000000) {
                        uVar17 = (uVar29 + 0xfe000000 >> 0x18) + 0x32;
                      }
                      else {
                        uVar17 = (uVar29 + 0xfc000000 >> 0x19) + 0x34;
                      }
                      goto LAB_0010d5df;
                    }
                    bVar7 = pCVar10->m_slot_tab2[uVar29 >> 0x10];
                  }
                  uVar17 = (uint)bVar7;
                }
LAB_0010d5df:
                if (uVar16 < 0x1000) {
                  uVar13 = (uint)pCVar10->m_slot_tab0[uVar16];
                }
                else if (uVar16 < 0x100000) {
                  uVar13 = (uint)pCVar10->m_slot_tab1[uVar16 >> 0xb];
                }
                else if (uVar16 < 0x1000000) {
                  uVar13 = (uint)pCVar10->m_slot_tab2[uVar16 >> 0x10];
                }
                else if (uVar16 < 0x2000000) {
                  uVar13 = (uVar16 - 0x1000000 >> 0x17) + 0x30;
                }
                else if (uVar16 < 0x4000000) {
                  uVar13 = (uVar16 + 0xfe000000 >> 0x18) + 0x32;
                }
                else {
                  uVar13 = (uVar16 + 0xfc000000 >> 0x19) + 0x34;
                }
                if ((uVar13 < uVar17) ||
                   ((((7 < uVar13 && (uVar13 == uVar17)) &&
                     ((uVar16 - (pCVar10->super_CLZDecompBase).m_lzx_position_base[uVar13] &
                       (pCVar10->super_CLZDecompBase).m_lzx_position_extra_mask[uVar13] & 0xf) <
                      ((pCVar10->super_CLZDecompBase).m_lzx_position_extra_mask[uVar17] &
                       uVar29 - (pCVar10->super_CLZDecompBase).m_lzx_position_base[uVar17] & 0xf)))
                    || ((!(bool)(bVar37 | uVar17 < uVar13) &&
                        (bVar7 = *(byte *)((long)plVar14 + (ulong)uVar32),
                        (byte)g_hamming_dist[bVar7 ^ *(byte *)((long)plVar2 + (ulong)uVar32)] <
                        (byte)g_hamming_dist
                              [puVar8[this->m_max_dict_size_mask & (uVar26 + uVar32) - uVar29] ^
                               bVar7])))))) {
                  *(uint *)((long)local_5b8 + -5) = uVar16;
                }
              }
            }
            else {
              *(char *)(local_5b8 + 1) = (char)uVar32 + -2;
              *local_5b8 = uVar16;
              local_5b8 = (uint *)((long)local_5b8 + 5);
            }
            if (*(byte *)((long)plVar2 + (ulong)uVar32) < *(byte *)((long)plVar14 + (ulong)uVar32))
            {
              pnVar34->m_left = uVar12;
              pnVar34 = (node *)&pnVar18->m_right;
              pnVar18 = pnVar19;
              pnVar28 = pnVar34;
            }
            else {
              pnVar19->m_left = uVar12;
              pnVar28 = pnVar18;
            }
            bVar37 = pnVar28->m_left != uVar12;
            pnVar19 = pnVar18;
            uVar12 = pnVar28->m_left;
          }
LAB_0010d7c5:
        } while (bVar37);
        uVar16 = ((int)local_5b8 - (int)local_538) * -0x33333333;
        if (uVar16 == 0) {
          LOCK();
          (this->m_match_refs).m_p[uVar36 - this->m_fill_lookahead_pos] = -2;
          UNLOCK();
        }
        else {
          *(byte *)((long)local_5b8 + -2) = *(byte *)((long)local_5b8 + -2) | 0x80;
          uVar12 = this->m_max_matches;
          if (uVar16 <= this->m_max_matches) {
            uVar12 = uVar16;
          }
          LOCK();
          paVar1 = &this->m_next_match_ref;
          uVar30 = *paVar1;
          *paVar1 = *paVar1 + (ulong)uVar12;
          UNLOCK();
          memcpy((this->m_matches).m_p + (uVar30 & 0xffffffff),
                 (void *)((long)local_538 + (ulong)(uVar16 - uVar12) * 5),(ulong)uVar12 * 5);
          LOCK();
          (this->m_match_refs).m_p[uVar36 - this->m_fill_lookahead_pos] = uVar30 & 0xffffffff;
          UNLOCK();
        }
      }
      uVar36 = uVar36 + 1;
      local_594 = local_594 + 1;
      uVar23 = uVar23 - 1;
      uVar16 = (uint)bVar5;
      uVar12 = uVar20;
    } while (2 < uVar23);
    uVar23 = 2;
  }
  for (; uVar23 != 0; uVar23 = uVar23 - 1) {
    pnVar34 = (this->m_nodes).m_p + (this->m_max_dict_size_mask & uVar36);
    pnVar34->m_left = 0;
    pnVar34->m_right = 0;
    LOCK();
    (this->m_match_refs).m_p[uVar36 - this->m_fill_lookahead_pos] = -2;
    UNLOCK();
    uVar36 = uVar36 + 1;
  }
  LOCK();
  this->m_num_completed_helper_threads = this->m_num_completed_helper_threads + 1;
  UNLOCK();
  return;
}

Assistant:

void search_accelerator::find_all_matches_callback(uint64 data, void* pData_ptr)
   {
      scoped_perf_section find_all_matches_timer("find_all_matches_callback");

      pData_ptr;
      const uint thread_index = (uint)data;

      dict_match temp_matches[cMatchAccelMaxSupportedProbes * 2];

      uint fill_lookahead_pos = m_fill_lookahead_pos;
      uint fill_dict_size = m_fill_dict_size;
      uint fill_lookahead_size = m_fill_lookahead_size;

      uint c0 = 0, c1 = 0;
      if (fill_lookahead_size >= 2)
      {
         c0 = m_dict[fill_lookahead_pos & m_max_dict_size_mask];
         c1 = m_dict[(fill_lookahead_pos & m_max_dict_size_mask) + 1];
      }

      const uint8* pDict = m_dict.get_ptr();

      while (fill_lookahead_size >= 3)
      {
         uint insert_pos = fill_lookahead_pos & m_max_dict_size_mask;

         uint c2 = pDict[insert_pos + 2];
         uint h = hash3_to_16(c0, c1, c2);
         c0 = c1;
         c1 = c2;

         LZHAM_ASSERT(!m_hash_thread_index.size() || (m_hash_thread_index[h] != UINT8_MAX));

         // Only process those strings that this worker thread was assigned to - this allows us to manipulate multiple trees in parallel with no worries about synchronization.
         if (m_hash_thread_index.size() && (m_hash_thread_index[h] != thread_index))
         {
            fill_lookahead_pos++;
            fill_lookahead_size--;
            fill_dict_size++;
            continue;
         }

         dict_match* pDstMatch = temp_matches;

         uint cur_pos = m_hash[h];
         m_hash[h] = static_cast<uint>(fill_lookahead_pos);

         uint *pLeft = &m_nodes[insert_pos].m_left;
         uint *pRight = &m_nodes[insert_pos].m_right;

         const uint max_match_len = LZHAM_MIN(CLZBase::cMaxMatchLen, fill_lookahead_size);
         uint best_match_len = 2;

         const uint8* pIns = &pDict[insert_pos];

         uint n = m_max_probes;
         for ( ; ; )
         {
            uint delta_pos = fill_lookahead_pos - cur_pos;
            if ((n-- == 0) || (!delta_pos) || (delta_pos >= fill_dict_size))
            {
               *pLeft = 0;
               *pRight = 0;
               break;
            }

            uint pos = cur_pos & m_max_dict_size_mask;
            node *pNode = &m_nodes[pos];

            // Unfortunately, the initial compare match_len must be 2 because of the way we truncate matches at the end of each block.
            uint match_len = 0;
            const uint8* pComp = &pDict[pos];

#if LZHAM_PLATFORM_X360
            for ( ; match_len < max_match_len; match_len++)
               if (pComp[match_len] != pIns[match_len])
                  break;
#else
            // Compare a qword at a time for a bit more efficiency.
            const uint64* pComp_end = reinterpret_cast<const uint64*>(pComp + max_match_len - 7);
            const uint64* pComp_cur = reinterpret_cast<const uint64*>(pComp);
            const uint64* pIns_cur = reinterpret_cast<const uint64*>(pIns);
            while (pComp_cur < pComp_end)
            {
               if (*pComp_cur != *pIns_cur)
                  break;
               pComp_cur++;
               pIns_cur++;
            }
            uint alt_match_len = static_cast<uint>(reinterpret_cast<const uint8*>(pComp_cur) - reinterpret_cast<const uint8*>(pComp));
            for ( ; alt_match_len < max_match_len; alt_match_len++)
               if (pComp[alt_match_len] != pIns[alt_match_len])
                  break;
#ifdef LZVERIFY
            for ( ; match_len < max_match_len; match_len++)
               if (pComp[match_len] != pIns[match_len])
                  break;
            LZHAM_VERIFY(alt_match_len == match_len);
#endif
            match_len = alt_match_len;
#endif

            if (match_len > best_match_len)
            {
               pDstMatch->m_len = static_cast<uint8>(match_len - CLZBase::cMinMatchLen);
               pDstMatch->m_dist = delta_pos;
               pDstMatch++;

               best_match_len = match_len;

               if (match_len == max_match_len)
               {
                  *pLeft = pNode->m_left;
                  *pRight = pNode->m_right;
                  break;
               }
            }
            else if (m_all_matches)
            {
               pDstMatch->m_len = static_cast<uint8>(match_len - CLZBase::cMinMatchLen);
               pDstMatch->m_dist = delta_pos;
               pDstMatch++;
            }
            else if ((best_match_len > 2) && (best_match_len == match_len))
            {
               uint bestMatchDist = pDstMatch[-1].m_dist;
               uint compMatchDist = delta_pos;

               uint bestMatchSlot, bestMatchSlotOfs;
               m_pLZBase->compute_lzx_position_slot(bestMatchDist, bestMatchSlot, bestMatchSlotOfs);

               uint compMatchSlot, compMatchOfs;
               m_pLZBase->compute_lzx_position_slot(compMatchDist, compMatchSlot, compMatchOfs);

               // If both matches uses the same match slot, choose the one with the offset containing the lowest nibble as these bits separately entropy coded.
               // This could choose a match which is further away in the absolute sense, but closer in a coding sense.
               if ( (compMatchSlot < bestMatchSlot) ||
                  ((compMatchSlot >= 8) && (compMatchSlot == bestMatchSlot) && ((compMatchOfs & 15) < (bestMatchSlotOfs & 15))) )
               {
                  LZHAM_ASSERT((pDstMatch[-1].m_len + (uint)CLZBase::cMinMatchLen) == best_match_len);
                  pDstMatch[-1].m_dist = delta_pos;
               }
               else if ((match_len < max_match_len) && (compMatchSlot <= bestMatchSlot))
               {
                  // Choose the match which has lowest hamming distance in the mismatch byte for a tiny win on binary files.
                  // TODO: This competes against the prev. optimization.
                  uint desired_mismatch_byte = pIns[match_len];

                  uint cur_mismatch_byte = pDict[(insert_pos - bestMatchDist + match_len) & m_max_dict_size_mask];
                  uint cur_mismatch_dist = g_hamming_dist[cur_mismatch_byte ^ desired_mismatch_byte];

                  uint new_mismatch_byte = pComp[match_len];
                  uint new_mismatch_dist = g_hamming_dist[new_mismatch_byte ^ desired_mismatch_byte];
                  if (new_mismatch_dist < cur_mismatch_dist)
                  {
                     LZHAM_ASSERT((pDstMatch[-1].m_len + (uint)CLZBase::cMinMatchLen) == best_match_len);
                     pDstMatch[-1].m_dist = delta_pos;
                  }
               }
            }

            uint new_pos;
            if (pComp[match_len] < pIns[match_len])
            {
               *pLeft = cur_pos;
               pLeft = &pNode->m_right;
               new_pos = pNode->m_right;
            }
            else
            {
               *pRight = cur_pos;
               pRight = &pNode->m_left;
               new_pos = pNode->m_left;
            }
            if (new_pos == cur_pos)
               break;
            cur_pos = new_pos;
         }

         const uint num_matches = (uint)(pDstMatch - temp_matches);

         if (num_matches)
         {
            pDstMatch[-1].m_dist |= 0x80000000;

            const uint num_matches_to_write = LZHAM_MIN(num_matches, m_max_matches);

            const uint match_ref_ofs = atomic_exchange_add(&m_next_match_ref, num_matches_to_write);

            memcpy(&m_matches[match_ref_ofs],
                   temp_matches + (num_matches - num_matches_to_write),
                   sizeof(temp_matches[0]) * num_matches_to_write);

            // FIXME: This is going to really hurt on platforms requiring export barriers.
            LZHAM_MEMORY_EXPORT_BARRIER

            atomic_exchange32((atomic32_t*)&m_match_refs[static_cast<uint>(fill_lookahead_pos - m_fill_lookahead_pos)], match_ref_ofs);
         }
         else
         {
            atomic_exchange32((atomic32_t*)&m_match_refs[static_cast<uint>(fill_lookahead_pos - m_fill_lookahead_pos)], -2);
         }

         fill_lookahead_pos++;
         fill_lookahead_size--;
         fill_dict_size++;
      }

      while (fill_lookahead_size)
      {
         uint insert_pos = fill_lookahead_pos & m_max_dict_size_mask;
         m_nodes[insert_pos].m_left = 0;
         m_nodes[insert_pos].m_right = 0;

         atomic_exchange32((atomic32_t*)&m_match_refs[static_cast<uint>(fill_lookahead_pos - m_fill_lookahead_pos)], -2);

         fill_lookahead_pos++;
         fill_lookahead_size--;
         fill_dict_size++;
      }
      
      atomic_increment32(&m_num_completed_helper_threads);
   }